

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CMStateSet.hpp
# Opt level: O0

bool __thiscall xercesc_4_0::CMStateSet::getBit(CMStateSet *this,XMLSize_t bitToGet)

{
  ArrayIndexOutOfBoundsException *pAVar1;
  ulong uVar2;
  ulong uVar3;
  bool local_6a;
  bool local_69;
  XMLSize_t byteOfs_1;
  XMLInt32 mask_1;
  XMLSize_t vectorOfs;
  XMLSize_t byteOfs;
  XMLInt32 mask;
  XMLSize_t bitToGet_local;
  CMStateSet *this_local;
  
  if (bitToGet < this->fBitCount) {
    if (this->fDynamicBuffer == (CMDynamicBuffer *)0x0) {
      local_69 = false;
      if (this->fBits[bitToGet >> 5] != 0) {
        local_69 = (this->fBits[bitToGet >> 5] & (uint)(1L << ((byte)bitToGet & 0x1f))) != 0;
      }
      this_local._7_1_ = local_69;
    }
    else {
      uVar2 = bitToGet >> 10;
      if (this->fDynamicBuffer->fBitArray[uVar2] == (XMLInt32 *)0x0) {
        this_local._7_1_ = false;
      }
      else {
        uVar3 = (bitToGet & 0x3ff) >> 5;
        local_6a = false;
        if (this->fDynamicBuffer->fBitArray[uVar2][uVar3] != 0) {
          local_6a = (this->fDynamicBuffer->fBitArray[uVar2][uVar3] &
                     (uint)(1L << ((byte)bitToGet & 0x1f))) != 0;
        }
        this_local._7_1_ = local_6a;
      }
    }
    return this_local._7_1_;
  }
  if (this->fDynamicBuffer != (CMDynamicBuffer *)0x0) {
    pAVar1 = (ArrayIndexOutOfBoundsException *)__cxa_allocate_exception(0x30);
    ArrayIndexOutOfBoundsException::ArrayIndexOutOfBoundsException
              (pAVar1,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/common/CMStateSet.hpp"
               ,0x16d,Bitset_BadIndex,this->fDynamicBuffer->fMemoryManager);
    __cxa_throw(pAVar1,&ArrayIndexOutOfBoundsException::typeinfo,
                ArrayIndexOutOfBoundsException::~ArrayIndexOutOfBoundsException);
  }
  pAVar1 = (ArrayIndexOutOfBoundsException *)__cxa_allocate_exception(0x30);
  ArrayIndexOutOfBoundsException::ArrayIndexOutOfBoundsException
            (pAVar1,
             "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/common/CMStateSet.hpp"
             ,0x16f,Bitset_BadIndex,(MemoryManager *)0x0);
  __cxa_throw(pAVar1,&ArrayIndexOutOfBoundsException::typeinfo,
              ArrayIndexOutOfBoundsException::~ArrayIndexOutOfBoundsException);
}

Assistant:

bool getBit(const XMLSize_t bitToGet) const
    {
        if (bitToGet >= fBitCount)
        {
            if(fDynamicBuffer)
                ThrowXMLwithMemMgr(ArrayIndexOutOfBoundsException, XMLExcepts::Bitset_BadIndex, fDynamicBuffer->fMemoryManager);
            else
                ThrowXML(ArrayIndexOutOfBoundsException, XMLExcepts::Bitset_BadIndex);
        }

        // And access the right bit and byte
        if(fDynamicBuffer==0)
        {
            const XMLInt32 mask = 1UL << (bitToGet % 32);
            const XMLSize_t byteOfs = bitToGet / 32;
            return (fBits[byteOfs]!=0 && (fBits[byteOfs] & mask) != 0);
        }
        else
        {
            const XMLSize_t vectorOfs = bitToGet / CMSTATE_BITFIELD_CHUNK;
            if(fDynamicBuffer->fBitArray[vectorOfs]==NULL)
                return false;
            const XMLInt32 mask = 1UL << (bitToGet % 32);
            const XMLSize_t byteOfs = (bitToGet % CMSTATE_BITFIELD_CHUNK) / 32;
            return (fDynamicBuffer->fBitArray[vectorOfs][byteOfs]!=0 && (fDynamicBuffer->fBitArray[vectorOfs][byteOfs] & mask) != 0);
        }
    }